

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_aes256gcm(void)

{
  ptls_cipher_suite_t *cs1;
  
  cs1 = find_cipher(ctx,0x1302);
  if (cs1 != (ptls_cipher_suite_t *)0x0) {
    test_ciphersuite(cs1,cs1);
    test_aad_ciphersuite(cs1,cs1);
    return;
  }
  return;
}

Assistant:

static void test_aes256gcm(void)
{
    ptls_cipher_suite_t *cs = find_cipher(ctx, PTLS_CIPHER_SUITE_AES_256_GCM_SHA384),
                        *cs_peer = find_cipher(ctx, PTLS_CIPHER_SUITE_AES_256_GCM_SHA384);

    if (cs != NULL && cs_peer != NULL) {
        test_ciphersuite(cs, cs_peer);
        test_aad_ciphersuite(cs, cs_peer);
    }
}